

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O0

cio_socket * alloc_echo_client(void)

{
  void *pvVar1;
  echo_client *client;
  
  pvVar1 = malloc(0x260);
  if (pvVar1 == (void *)0x0) {
    client = (echo_client *)0x0;
  }
  else {
    cio_read_buffer_init
              ((cio_read_buffer *)((long)pvVar1 + 0x1c0),(void *)((long)pvVar1 + 0x1e0),0x80);
    client = (echo_client *)((long)pvVar1 + 0xa8);
  }
  return (cio_socket *)client;
}

Assistant:

static struct cio_socket *alloc_echo_client(void)
{
	struct echo_client *client = malloc(sizeof(*client));
	if (cio_unlikely(client == NULL)) {
		return NULL;
	}

	cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));

	return &client->socket;
}